

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Face.cpp
# Opt level: O1

void __thiscall
Nova::Grid_Iterator_Face<float,_1>::Reset_Axis(Grid_Iterator_Face<float,_1> *this,int axis_input)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  this->axis = axis_input;
  (this->super_Grid_Iterator<float,_1>).number_of_regions = 0;
  if (Interior_Region < this->region_type) {
LAB_0011efa3:
    __assert_fail("(region_type==Grid<T,d>::Interior_Region) && !side",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Face.cpp"
                  ,99,
                  "void Nova::Grid_Iterator_Face<float, 1>::Reset_Axis(const int) [T = float, d = 1]"
                 );
  }
  iVar5 = this->number_of_ghost_cells;
  iVar4 = 1 - iVar5;
  iVar3 = (((this->super_Grid_Iterator<float,_1>).grid)->counts)._data._M_elems[0] + iVar5;
  switch(this->region_type) {
  case Whole_Region:
    if (this->side != 0) {
      __assert_fail("!side",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Face.cpp"
                    ,0x31,
                    "void Nova::Grid_Iterator_Face<float, 1>::Reset_Axis(const int) [T = float, d = 1]"
                   );
    }
    if (axis_input != 0) {
LAB_0011ef8d:
      lVar7 = (long)axis_input;
LAB_0011ef90:
      std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",lVar7,1);
    }
    iVar3 = iVar3 + 1;
    break;
  case Ghost_Region:
    uVar1 = this->side;
    if (uVar1 == 0) {
      iVar8 = -1;
      do {
        iVar6 = this->axis;
        lVar7 = (long)iVar6;
        if (iVar8 == 0) {
          if (iVar6 != 0) goto LAB_0011ef90;
          iVar6 = (iVar3 + 1) - this->number_of_ghost_cells;
          if (iVar6 <= iVar3) {
            iVar6 = iVar6 + 1;
            iVar9 = iVar3 + 1;
            goto LAB_0011ef4d;
          }
        }
        else {
          if (iVar6 != 0) goto LAB_0011ef90;
          if (0 < this->number_of_ghost_cells) {
            iVar9 = this->number_of_ghost_cells - iVar5;
            iVar6 = iVar4;
LAB_0011ef4d:
            iVar2 = (this->super_Grid_Iterator<float,_1>).number_of_regions;
            (this->super_Grid_Iterator<float,_1>).number_of_regions = iVar2 + 1;
            (this->super_Grid_Iterator<float,_1>).regions[iVar2].min_corner._data._M_elems[0] =
                 iVar6;
            (this->super_Grid_Iterator<float,_1>).regions[iVar2].max_corner._data._M_elems[0] =
                 iVar9;
          }
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != 1);
      goto LAB_0011ef6b;
    }
    iVar8 = (int)((uVar1 - ((int)(uVar1 + 1) >> 0x1f)) + 1) >> 1;
    if ((uVar1 & 1) != 0) {
      if ((axis_input != 0) || (axis_input = iVar8 + -1, axis_input != 0)) goto LAB_0011ef8d;
      if (0 < iVar5) {
        (this->super_Grid_Iterator<float,_1>).number_of_regions = 1;
        (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0] = iVar4;
        (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0] = 0;
      }
    }
    if ((this->side & 1) == 0) {
      lVar7 = (long)this->axis;
      if (lVar7 == 0) {
        iVar8 = iVar8 + -1;
        if (iVar8 == 0) {
          iVar5 = (iVar3 + 1) - this->number_of_ghost_cells;
          if (iVar5 <= iVar3) {
            iVar4 = (this->super_Grid_Iterator<float,_1>).number_of_regions;
            (this->super_Grid_Iterator<float,_1>).number_of_regions = iVar4 + 1;
            (this->super_Grid_Iterator<float,_1>).regions[iVar4].min_corner._data._M_elems[0] =
                 iVar5 + 1;
            (this->super_Grid_Iterator<float,_1>).regions[iVar4].max_corner._data._M_elems[0] =
                 iVar3 + 1;
          }
          goto LAB_0011ef6b;
        }
        lVar7 = (long)iVar8;
      }
      goto LAB_0011ef90;
    }
    goto LAB_0011ef6b;
  case Boundary_Region:
    if (this->side == 0 || (this->side & 1U) != 0) {
      if (axis_input != 0) goto LAB_0011ef8d;
      (this->super_Grid_Iterator<float,_1>).number_of_regions = 1;
      (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0] = iVar4;
      (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0] = iVar4;
    }
    if ((this->side & 1) == 0) {
      lVar7 = (long)this->axis;
      if (lVar7 != 0) goto LAB_0011ef90;
      iVar5 = (this->super_Grid_Iterator<float,_1>).number_of_regions;
      (this->super_Grid_Iterator<float,_1>).number_of_regions = iVar5 + 1;
      (this->super_Grid_Iterator<float,_1>).regions[iVar5].min_corner._data._M_elems[0] = iVar3 + 1;
      (this->super_Grid_Iterator<float,_1>).regions[iVar5].max_corner._data._M_elems[0] = iVar3 + 1;
    }
    goto LAB_0011ef6b;
  case Interior_Region:
    if (this->side != 0) goto LAB_0011efa3;
    if (axis_input != 0) goto LAB_0011ef8d;
    iVar4 = 2 - iVar5;
  }
  if (iVar4 <= iVar3) {
    (this->super_Grid_Iterator<float,_1>).number_of_regions = 1;
    (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0] = iVar4;
    (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0] = iVar3;
  }
LAB_0011ef6b:
  iVar5 = (this->super_Grid_Iterator<float,_1>).number_of_regions;
  (this->super_Grid_Iterator<float,_1>).valid = 0 < iVar5;
  if (0 < iVar5) {
    (this->super_Grid_Iterator<float,_1>).current_region = 0;
    iVar5 = (this->super_Grid_Iterator<float,_1>).regions[0].min_corner._data._M_elems[0];
    iVar3 = (this->super_Grid_Iterator<float,_1>).regions[0].max_corner._data._M_elems[0];
    (this->super_Grid_Iterator<float,_1>).region.min_corner._data._M_elems[0] = iVar5;
    (this->super_Grid_Iterator<float,_1>).region.max_corner._data._M_elems[0] = iVar3;
    (this->super_Grid_Iterator<float,_1>).index._data._M_elems[0] = iVar5;
  }
  return;
}

Assistant:

void Grid_Iterator_Face<T,d>::
Reset_Axis(const int axis_input)
{
    axis=axis_input;
    Reset_Regions();
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:       assert(!side);
                                            ++domain.max_corner(axis);
                                            Add_Region(domain);
                                            break;

        case Grid<T,d>::Ghost_Region:       if(!side)
                                            {
                                                for(int side_iterator=1;side_iterator<=2*d;++side_iterator){
                                                    int axis_of_side=(side_iterator+1)/2;
                                                    if(side_iterator&1){
                                                        Range<int,d> domain_copy(domain);
                                                        ++domain_copy.max_corner(axis);
                                                        domain_copy.max_corner(axis_of_side-1)=domain_copy.min_corner(axis_of_side-1)+number_of_ghost_cells-1;
                                                        Add_Region(domain_copy);}
                                                    if(!(side_iterator&1)){
                                                        Range<int,d> domain_copy(domain);
                                                        ++domain_copy.max_corner(axis);
                                                        domain_copy.min_corner(axis_of_side-1)=domain_copy.max_corner(axis_of_side-1)-number_of_ghost_cells+1;
                                                        Add_Region(domain_copy);}}
                                            }
                                            else
                                            {
                                                int axis_of_side=(side+1)/2;
                                                if(side&1){
                                                    Range<int,d> domain_copy(domain);
                                                    ++domain_copy.max_corner(axis);
                                                    domain_copy.max_corner(axis_of_side-1)=domain_copy.min_corner(axis_of_side-1)+number_of_ghost_cells-1;
                                                    Add_Region(domain_copy);}
                                                if(!(side&1)){
                                                    Range<int,d> domain_copy(domain);
                                                    ++domain_copy.max_corner(axis);
                                                    domain_copy.min_corner(axis_of_side-1)=domain_copy.max_corner(axis_of_side-1)-number_of_ghost_cells+1;
                                                    Add_Region(domain_copy);}
                                            }
                                            break;

        case Grid<T,d>::Boundary_Region:    if(!side || side&1)
                                            {
                                                Range<int,d> domain_copy(domain);
                                                domain_copy.max_corner(axis)=domain.min_corner(axis);
                                                Add_Region(domain_copy);
                                            }
                                            if(!side || !(side&1))
                                            {
                                                Range<int,d> domain_copy(domain);
                                                domain_copy.min_corner(axis)=domain_copy.max_corner(axis)=domain.max_corner(axis)+1;
                                                Add_Region(domain_copy);
                                            }
                                            break;

        default:                            assert((region_type==Grid<T,d>::Interior_Region) && !side);
                                            ++domain.min_corner(axis);
                                            Add_Region(domain);
                                            break;
    }
    Reset();
}